

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::Write(ON_Mesh *this,ON_BinaryArchive *file)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  float fVar4;
  endian eVar5;
  uint uVar6;
  ON__UINT32 OVar7;
  ON_2dPoint *pOVar8;
  ON_2dPoint *pOVar9;
  ON_V5_MeshDoubleVertices *this_00;
  float fVar10;
  uint local_78;
  ON_V5_MeshDoubleVertices *ud;
  bool bHasDoublePrecisionVertices;
  bool bHasNgons;
  endian e;
  uint Scount;
  undefined4 uStack_44;
  uchar b;
  float fbbox [2] [3];
  uint fcount;
  uint vcount;
  bool rc;
  int minor_version;
  int major_version;
  int i;
  ON_BinaryArchive *file_local;
  ON_Mesh *this_local;
  
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  uVar6 = 5;
  if (0x3b < iVar3) {
    uVar6 = 8;
  }
  fcount._3_1_ = ON_BinaryArchive::Write3dmChunkVersion(file,3,uVar6);
  fbbox[1][2] = (float)VertexUnsignedCount(this);
  fbbox[1][1] = (float)FaceUnsignedCount(this);
  if (fcount._3_1_) {
    fcount._3_1_ = ON_BinaryArchive::WriteInt(file,(ON__UINT32)fbbox[1][2]);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteInt(file,(ON__UINT32)fbbox[1][1]);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x270);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x280);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x240);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteInterval(file,(ON_Interval *)&this->field_0x250);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteDouble(file,2,this->m_srf_scale);
  }
  _Scount = 0x3f8000003f800000;
  fbbox[0][0] = 1.0;
  fbbox[0][1] = -1.0;
  fbbox[0][2] = -1.0;
  fbbox[1][0] = -1.0;
  bVar2 = ON_BoundingBox::IsNotEmpty(&this->m_vertex_bbox);
  if (bVar2) {
    fVar10 = ON_FloatFloor((this->m_vertex_bbox).m_min.x);
    _Scount = CONCAT44(uStack_44,fVar10);
    fVar10 = ON_FloatFloor((this->m_vertex_bbox).m_min.y);
    _Scount = CONCAT44(fVar10,Scount);
    fVar10 = ON_FloatFloor((this->m_vertex_bbox).m_min.z);
    fbbox[0][0] = fVar10;
    fVar10 = ON_FloatCeil((this->m_vertex_bbox).m_max.x);
    fbbox[0][1] = fVar10;
    fVar10 = ON_FloatCeil((this->m_vertex_bbox).m_max.y);
    fbbox[0][2] = fVar10;
    fVar10 = ON_FloatCeil((this->m_vertex_bbox).m_max.z);
    fbbox[1][0] = fVar10;
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteFloat(file,6,(float *)&Scount);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteFloat(file,6,this->m_nbox[0]);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteFloat(file,4,this->m_tbox[0]);
  }
  minor_version = -1;
  cVar1 = this->m_mesh_is_closed;
  if (cVar1 == '\0') {
    minor_version = -1;
  }
  else if (cVar1 == '\x01') {
    minor_version = 1;
  }
  else if (cVar1 == '\x02') {
    minor_version = 0;
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteInt(file,minor_version);
  }
  bVar2 = this->m_mesh_parameters != (ON_MeshParameters *)0x0;
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteChar(file,bVar2);
  }
  if ((fcount._3_1_ != false) && (bVar2)) {
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    }
    if (fcount._3_1_ != false) {
      fcount._3_1_ = ON_MeshParameters::Write(this->m_mesh_parameters,file);
      bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if (!bVar2) {
        fcount._3_1_ = false;
      }
    }
  }
  for (minor_version = 0; fcount._3_1_ != false && minor_version < 4;
      minor_version = minor_version + 1) {
    bVar2 = this->m_kstat[minor_version] != (ON_MeshCurvatureStats *)0x0;
    fcount._3_1_ = ON_BinaryArchive::WriteChar(file,bVar2);
    if ((bVar2) &&
       (fcount._3_1_ = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0), fcount._3_1_)) {
      fcount._3_1_ = ON_MeshCurvatureStats::Write(this->m_kstat[minor_version],file);
      bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if (!bVar2) {
        fcount._3_1_ = false;
      }
    }
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = WriteFaceArray(this,(int)fbbox[1][2],(int)fbbox[1][1],file);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = Write_2(this,(int)fbbox[1][2],file);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteInt(file,(uint)((this->m_packed_tex_rotate & 1U) != 0));
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteUuid(file,&(this->m_Ttag).m_mapping_id);
  }
  fVar10 = fbbox[1][2];
  if ((fcount._3_1_ != false) && (fbbox[1][2] != 0.0)) {
    fVar4 = (float)ON_SimpleArray<ON_2dPoint>::UnsignedCount
                             (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
    if (fVar10 == fVar4) {
      local_78 = ON_SimpleArray<ON_2dPoint>::UnsignedCount
                           (&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
    }
    else {
      local_78 = 0;
    }
    eVar5 = ON_BinaryArchive::Endian(file);
    if (eVar5 == big_endian) {
      pOVar8 = ON_SimpleArray<ON_2dPoint>::Array(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
      pOVar9 = ON_SimpleArray<ON_2dPoint>::Array(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
      ON_BinaryArchive::ToggleByteOrder((ulong)(local_78 << 1),8,pOVar8,pOVar9);
    }
    if (fcount._3_1_ != false) {
      pOVar8 = ON_SimpleArray<ON_2dPoint>::Array(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
      fcount._3_1_ = ON_BinaryArchive::WriteCompressedBuffer(file,(ulong)local_78 << 4,pOVar8);
    }
    if (eVar5 == big_endian) {
      pOVar8 = ON_SimpleArray<ON_2dPoint>::Array(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
      pOVar9 = ON_SimpleArray<ON_2dPoint>::Array(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
      ON_BinaryArchive::ToggleByteOrder((ulong)(local_78 << 1),8,pOVar8,pOVar9);
    }
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_MappingTag::Write(&this->m_Ttag,file);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteChar(file,this->m_mesh_is_manifold);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteChar(file,this->m_mesh_is_oriented);
  }
  if (fcount._3_1_ != false) {
    fcount._3_1_ = ON_BinaryArchive::WriteChar(file,this->m_mesh_is_solid);
  }
  if ((fcount._3_1_ != false) && (5 < uVar6)) {
    bVar2 = HasNgons(this);
    fcount._3_1_ = ON_BinaryArchive::WriteBool(file,bVar2);
    if ((fcount._3_1_) && (bVar2)) {
      fcount._3_1_ = WriteMeshNgons(file,&this->m_Ngon);
    }
    if ((fcount._3_1_ != false) && (6 < uVar6)) {
      bVar2 = HasDoublePrecisionVertices(this);
      if (fcount._3_1_ != false) {
        fcount._3_1_ = ON_BinaryArchive::WriteBool(file,bVar2);
      }
      if ((fcount._3_1_ != false) && (bVar2)) {
        fcount._3_1_ = WriteMeshDoublePrecisionVertices
                                 (file,&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
      }
      if ((fcount._3_1_ != false) && (7 < uVar6)) {
        fcount._3_1_ = ON_BinaryArchive::WriteBoundingBox(file,&this->m_vertex_bbox);
      }
    }
  }
  if ((((fcount._3_1_ != false) &&
       (iVar3 = ON_BinaryArchive::Archive3dmVersion(file), iVar3 == 0x32)) && (fbbox[1][2] != 0.0))
     && ((bVar2 = HasSynchronizedDoubleAndSinglePrecisionVertices(this), bVar2 &&
         (this_00 = ON_V5_MeshDoubleVertices::AttachV5(this),
         this_00 != (ON_V5_MeshDoubleVertices *)0x0)))) {
    ON_3dPointArray::operator=(&this_00->m_V5_dV,&this->m_dV);
    uVar6 = ON_SimpleArray<ON_3dPoint>::UnsignedCount
                      (&(this_00->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>);
    this_00->m_dcount = uVar6;
    OVar7 = ON_V5_MeshDoubleVertices::DoubleCRC(this_00);
    this_00->m_dCRC = OVar7;
    uVar6 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>)
    ;
    this_00->m_fcount = uVar6;
    OVar7 = ON_V5_MeshDoubleVertices::FloatCRC(&this->m_V);
    this_00->m_fCRC = OVar7;
  }
  return fcount._3_1_;
}

Assistant:

bool ON_Mesh::Write( ON_BinaryArchive& file ) const
{
  int i;
  //const int major_version = 1; // uncompressed
  //const int major_version = 2; // beta format (never used)
  const int major_version = 3; // compressed

  const int minor_version 
    = (file.Archive3dmVersion() >= 60) 
    //? 6  // ngons saved in V6 files as of mid November, 2013
    //? 7  // double precision vertices no longer on user data.
    ? 8  // double precision vertex box
    : 5;

  bool rc = file.Write3dmChunkVersion(major_version,minor_version);

  const unsigned int vcount = VertexUnsignedCount();
  const unsigned int fcount = FaceUnsignedCount();

  if (rc) rc = file.WriteInt( vcount );
  if (rc) rc = file.WriteInt( fcount );
  if (rc) rc = file.WriteInterval( m_packed_tex_domain[0] );
  if (rc) rc = file.WriteInterval( m_packed_tex_domain[1] );
  if (rc) rc = file.WriteInterval( m_srf_domain[0] );
  if (rc) rc = file.WriteInterval( m_srf_domain[1] );
  if (rc) rc = file.WriteDouble( 2, m_srf_scale );

  // legacy float precision vertex bounding box
  float fbbox[2][3] = { { 1.0f, 1.0f, 1.0f }, { -1.0f, -1.0f, -1.0f } };
  if (m_vertex_bbox.IsNotEmpty())
  {
    fbbox[0][0] = ON_FloatFloor(m_vertex_bbox.m_min.x);
    fbbox[0][1] = ON_FloatFloor(m_vertex_bbox.m_min.y);
    fbbox[0][2] = ON_FloatFloor(m_vertex_bbox.m_min.z);
    fbbox[1][0] = ON_FloatCeil(m_vertex_bbox.m_max.x);
    fbbox[1][1] = ON_FloatCeil(m_vertex_bbox.m_max.y);
    fbbox[1][2] = ON_FloatCeil(m_vertex_bbox.m_max.z);
  }
  if (rc) rc = file.WriteFloat( 6, &fbbox[0][0] );

  if (rc) rc = file.WriteFloat( 6, &m_nbox[0][0] );
  if (rc) rc = file.WriteFloat( 4, &m_tbox[0][0] );

  // archive int value meaning: -1 = unknown 0 = mesh is not closed, 1 = mesh is closed
  i = -1;
  switch( m_mesh_is_closed )
  {
  case 0: // unset
    i = -1;
    break;
  case 1: // closed
    i = 1;
    break;
  case 2: // not closed
    i = 0;
    break;
  }
  if (rc) rc = file.WriteInt( i );

  unsigned char b = m_mesh_parameters ? 1 : 0;
  if (rc) rc = file.WriteChar(b);
  if (rc && b) {
    if (rc) rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
    if (rc) {
      rc = m_mesh_parameters->Write(file);
      if ( !file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  for ( i = 0; rc && i < 4; i++ ) {
    b = m_kstat[i] ? 1 : 0;
    rc = file.WriteChar(b);
    if (b) {
      rc = file.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 0 );
      if (rc) {
        rc = m_kstat[i]->Write(file);
        if ( !file.EndWrite3dmChunk() )
          rc = false;
      }
    }
  }

  if (rc) rc = WriteFaceArray( vcount, fcount, file );

  if (rc) {
    // major version is a hard coded 3

    //if ( major_version == 1 )
    //  rc = Write_1(file);
    //else if ( major_version == 3 )
      rc = Write_2(vcount,file);
    //else
    //  rc = false;
  }

  // added for minor version 1.2 and 3.2
  i = m_packed_tex_rotate ? 1 : 0;
  if (rc) rc = file.WriteInt( i );

  // added for minor version 3.3
  if (rc) rc = file.WriteUuid( m_Ttag.m_mapping_id );
 
  // compressed m_S[]
  if ( rc && vcount > 0U ) 
  {
    // Before 201011049 there was a bug that let m_S[] arrays
    // with the wrong size get saved in files. 
    const unsigned int Scount = (vcount == m_S.UnsignedCount()) ? m_S.UnsignedCount() : 0;
    const ON::endian e = file.Endian();
    if (e == ON::endian::big_endian)
    {
      file.ToggleByteOrder( Scount*2, 8, m_S.Array(), (void*)m_S.Array() );
    }
    if (rc) rc = file.WriteCompressedBuffer( Scount*sizeof(ON_2dPoint),m_S.Array() );
    if (e == ON::endian::big_endian)
    {
      file.ToggleByteOrder( Scount*2, 8, m_S.Array(), (void*)m_S.Array() );
    }
  }

  // added for minor version 3.4
  if (rc) rc = m_Ttag.Write(file);

  // added for minor version 3.5
  if (rc) rc = file.WriteChar( m_mesh_is_manifold );
  if (rc) rc = file.WriteChar( m_mesh_is_oriented );
  if (rc) rc = file.WriteChar( m_mesh_is_solid );


  if ( rc && minor_version >= 6 )
  {
    // added n-gons version 3.6
    bool bHasNgons = HasNgons();    
    rc =  file.WriteBool(bHasNgons);
    if (rc && bHasNgons)
      rc = WriteMeshNgons(file,m_Ngon);

    if (rc && minor_version >= 7)
    {
      // added explicit double precision vertices chunk version 3.7
      // (used to be on user data)
      const bool bHasDoublePrecisionVertices = HasDoublePrecisionVertices();
      if (rc) rc = file.WriteBool(bHasDoublePrecisionVertices);
      if (rc && bHasDoublePrecisionVertices)
        rc = WriteMeshDoublePrecisionVertices(file, m_dV);

      if (rc && minor_version >= 8)
      {
        rc = file.WriteBoundingBox(m_vertex_bbox);
      }
    }
  }
  
  
  if (rc 
    && 50 == file.Archive3dmVersion() 
    && vcount > 0 
    && HasSynchronizedDoubleAndSinglePrecisionVertices() 
    )
  {
    // save double precision vertices using V5 user data.
    ON_V5_MeshDoubleVertices* ud = ON_V5_MeshDoubleVertices::AttachV5(this);
    if (nullptr != ud)
    {
      ud->m_V5_dV = m_dV;
      ud->m_dcount = ud->m_V5_dV.UnsignedCount();
      ud->m_dCRC = ud->DoubleCRC();
      ud->m_fcount = m_V.UnsignedCount();
      ud->m_fCRC = ON_V5_MeshDoubleVertices::FloatCRC(m_V);
      // This obsolete user data will be deleted after it is written to the V5 .3dm file.
    }
  }

  return rc;
}